

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_logger_fct.h
# Opt level: O1

void custlog__on_test_skip(fct_logger_i *l,fct_logger_evt_t *e)

{
  printf("on_test_suite_skip:\n    -      name: %s\n    - condition: %s\n",e->name,e->cndtn);
  return;
}

Assistant:

static void
custlog__on_test_skip(fct_logger_i *l, fct_logger_evt_t const *e)
{
    /* Conditional evaluation on why we skipped. */
    const char *condition = e->cndtn;
    /* Name of test suite skipped. */
    const char *name = e->name;
    (void)l;
    printf("on_test_suite_skip:\n"
           "    -      name: %s\n"
           "    - condition: %s\n",
           name,
           condition
          );
}